

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O3

void divsufsortxx::helper::
     heapsort<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator>
               (substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> Td,iterator SA,
               value_type size)

{
  long lVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  pos_type pVar6;
  long lVar7;
  BitmapArray<long> *pBVar8;
  ulong uVar9;
  ulong size_00;
  
  pVar6 = SA.pos_;
  pBVar8 = SA.array_;
  size_00 = size;
  if ((size & 1U) == 0) {
    size_00 = size - 1;
    lVar7 = ((size - ((long)size_00 >> 0x3f)) + -1 >> 1) + pVar6;
    iVar4 = (*(pBVar8->super_Bitmap)._vptr_Bitmap[5])(pBVar8);
    iVar4 = (*((Td.m_PA.array_)->super_Bitmap)._vptr_Bitmap[5])
                      (Td.m_PA.array_,CONCAT44(extraout_var,iVar4) + Td.m_PA.pos_);
    cVar2 = Td.m_Td[CONCAT44(extraout_var_00,iVar4)];
    lVar1 = size + -1 + pVar6;
    iVar4 = (*(pBVar8->super_Bitmap)._vptr_Bitmap[5])(pBVar8);
    iVar4 = (*((Td.m_PA.array_)->super_Bitmap)._vptr_Bitmap[5])
                      (Td.m_PA.array_,Td.m_PA.pos_ + CONCAT44(extraout_var_01,iVar4));
    if (cVar2 < Td.m_Td[CONCAT44(extraout_var_02,iVar4)]) {
      iVar4 = (*(pBVar8->super_Bitmap)._vptr_Bitmap[5])(pBVar8,lVar1);
      iVar5 = (*(pBVar8->super_Bitmap)._vptr_Bitmap[5])(pBVar8,lVar7);
      (*(pBVar8->super_Bitmap)._vptr_Bitmap[4])(pBVar8,lVar1,CONCAT44(extraout_var_04,iVar5));
      (*(pBVar8->super_Bitmap)._vptr_Bitmap[4])(pBVar8,lVar7,CONCAT44(extraout_var_03,iVar4));
    }
  }
  if (1 < (long)size_00) {
    uVar9 = (size_00 >> 1) + 1;
    do {
      fixdown<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator,long>
                (Td,SA,uVar9 - 2,size_00);
      uVar9 = uVar9 - 1;
    } while (1 < uVar9);
  }
  if ((size & 1U) == 0) {
    iVar4 = (*(pBVar8->super_Bitmap)._vptr_Bitmap[5])(pBVar8,pVar6);
    iVar5 = (*(pBVar8->super_Bitmap)._vptr_Bitmap[5])(pBVar8,size_00 + pVar6);
    (*(pBVar8->super_Bitmap)._vptr_Bitmap[4])(pBVar8,pVar6,CONCAT44(extraout_var_06,iVar5));
    (*(pBVar8->super_Bitmap)._vptr_Bitmap[4])
              (pBVar8,size_00 + pVar6,CONCAT44(extraout_var_05,iVar4));
    fixdown<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator,long>
              (Td,SA,0,size_00);
  }
  if (1 < (long)size_00) {
    do {
      uVar9 = size_00 - 1;
      iVar4 = (*(pBVar8->super_Bitmap)._vptr_Bitmap[5])(pBVar8,pVar6);
      iVar5 = (*(pBVar8->super_Bitmap)._vptr_Bitmap[5])(pBVar8,pVar6 + uVar9);
      (*(pBVar8->super_Bitmap)._vptr_Bitmap[4])(pBVar8,pVar6,CONCAT44(extraout_var_08,iVar5));
      fixdown<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator,long>
                (Td,SA,0,uVar9);
      (*(pBVar8->super_Bitmap)._vptr_Bitmap[4])
                (pBVar8,pVar6 + uVar9,CONCAT44(extraout_var_07,iVar4));
      bVar3 = 2 < size_00;
      size_00 = uVar9;
    } while (bVar3);
  }
  return;
}

Assistant:

void heapsort(const StringIterator_type Td, SAIterator_type SA,
              typename std::iterator_traits<SAIterator_type>::value_type size) {
  typedef typename std::iterator_traits<SAIterator_type>::value_type pos_type;
  pos_type i, m;
  pos_type t;

  m = size;
  if ((size % 2) == 0) {
    m--;
    if (Td[SA[m / 2]] < Td[SA[m]]) {
      std::iter_swap(SA + m, SA + m / 2);
    }
  }

  for (i = m / 2 - 1; 0 <= i; --i) {
    fixdown(Td, SA, i, m);
  }

  if ((size % 2) == 0) {
    std::iter_swap(SA, SA + m);
    fixdown(Td, SA, pos_type(0), m);
  }

  for (i = m - 1; 0 < i; --i) {
    t = SA[0];
    SA[0] = SA[i];
    fixdown(Td, SA, pos_type(0), i);
    SA[i] = t;
  }
}